

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

bool __thiscall
Js::DynamicProfileInfo::MayHaveNonBuiltinCallee(DynamicProfileInfo *this,ProfileId callSiteId)

{
  CallSiteInfo **ppCVar1;
  SourceId sourceId;
  AutoCriticalSection local_28;
  AutoCriticalSection cs;
  ProfileId callSiteId_local;
  DynamicProfileInfo *this_local;
  
  cs.cs._6_2_ = callSiteId;
  AutoCriticalSection::AutoCriticalSection(&local_28,(CriticalSection *)callSiteInfoCS);
  ppCVar1 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                      ((WriteBarrierPtr *)&this->callSiteInfo);
  if ((*(ushort *)&(*ppCVar1)[cs.cs._6_2_].field_0x2 >> 0xe & 1) == 0) {
    ppCVar1 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                        ((WriteBarrierPtr *)&this->callSiteInfo);
    if ((*(short *)&(*ppCVar1)[cs.cs._6_2_].field_0x2 < 0) ||
       (ppCVar1 = Memory::WriteBarrierPtr::operator_cast_to_CallSiteInfo__
                            ((WriteBarrierPtr *)&this->callSiteInfo),
       (*ppCVar1)[cs.cs._6_2_].u.functionData.sourceId != 0xfffffffe)) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = true;
  }
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  return this_local._7_1_;
}

Assistant:

bool DynamicProfileInfo::MayHaveNonBuiltinCallee(ProfileId callSiteId)
    {
        AutoCriticalSection cs(&this->callSiteInfoCS);

        if (this->callSiteInfo[callSiteId].dontInline)
        {
            return true;
        }

        if (!this->callSiteInfo[callSiteId].isPolymorphic)
        {
            Js::SourceId sourceId = this->callSiteInfo[callSiteId].u.functionData.sourceId;
            if (sourceId == BuiltInSourceId)
            {
                return false;
            }
        }

        return true;
    }